

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroProp.cpp
# Opt level: O0

Vector3d * __thiscall OpenMD::HydroProp::getCenterOfDiffusion(HydroProp *this,RealType temperature)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  RectMatrix<double,_3U,_3U> *m;
  Vector3<double> *this_00;
  Vector3d *in_RDI;
  SquareMatrix3<double> *this_01;
  Vector<double,_3U> *v;
  Vector<double,_3U> *v_00;
  Vector3d tmpVec;
  Mat3x3d tmp;
  Mat3x3d Dorr;
  RealType in_stack_000002b8;
  Vector3d *in_stack_000002c0;
  Mat3x3d Dotr;
  Mat6x6d Do;
  Vector3d origin;
  Vector3d *cod;
  Vector<double,_3U> *in_stack_fffffffffffffb68;
  Vector3<double> *in_stack_fffffffffffffb70;
  SquareMatrix3<double> *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  RectMatrix<double,_6U,_6U> *in_stack_fffffffffffffb90;
  Vector<double,_3U> local_288;
  RectMatrix<double,_3U,_3U> local_270;
  RectMatrix<double,_3U,_3U> local_228;
  RectMatrix<double,_3U,_3U> local_1d0 [5];
  double local_50;
  Vector<double,_3U> local_48 [3];
  
  local_50 = 0.0;
  Vector<double,_3U>::Vector(local_48,&local_50);
  Vector3<double>::Vector3(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  Vector3<double>::Vector3(in_stack_fffffffffffffb70,(Vector3<double> *)in_stack_fffffffffffffb68);
  getDiffusionTensorAtPos
            ((HydroProp *)
             Dotr.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0],
             in_stack_000002c0,in_stack_000002b8);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3ac4a9);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3ac4b8);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffffb90,(uint)((ulong)in_stack_fffffffffffffb88 >> 0x20),
             (uint)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            (in_stack_fffffffffffffb90,(uint)((ulong)in_stack_fffffffffffffb88 >> 0x20),
             (uint)in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x3ac503);
  Vector3<double>::Vector3((Vector3<double> *)0x3ac512);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,1,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,2,2);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,0,0);
  *pdVar3 = dVar1 + dVar2;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,0,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,0,1);
  *pdVar3 = -dVar1;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,0,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,0,2);
  *pdVar3 = -dVar1;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,0,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,1,0);
  *pdVar3 = -dVar1;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,0,0);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,2,2);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,1,1);
  *pdVar3 = dVar1 + dVar2;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,1,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,1,2);
  *pdVar3 = -dVar1;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,0,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,2,0);
  *pdVar3 = -dVar1;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,1,2);
  this_01 = (SquareMatrix3<double> *)((ulong)*pdVar3 ^ 0x8000000000000000);
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,2,1);
  *pdVar3 = (double)this_01;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,1,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_228,0,0);
  dVar2 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(&local_270,2,2);
  *pdVar3 = dVar1 + dVar2;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_1d0,1,2);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_1d0,2,1);
  dVar2 = *pdVar3;
  pdVar3 = Vector<double,_3U>::operator[](&local_288,0);
  *pdVar3 = dVar1 - dVar2;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_1d0,2,0);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_1d0,0,2);
  v = (Vector<double,_3U> *)(dVar1 - *pdVar3);
  m = (RectMatrix<double,_3U,_3U> *)Vector<double,_3U>::operator[](&local_288,1);
  m->data_[0][0] = (double)v;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_1d0,0,1);
  dVar1 = *pdVar3;
  pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_1d0,1,0);
  v_00 = (Vector<double,_3U> *)(dVar1 - *pdVar3);
  this_00 = (Vector3<double> *)Vector<double,_3U>::operator[](&local_288,2);
  (this_00->super_Vector<double,_3U>).data_[0] = (double)v_00;
  SquareMatrix3<double>::inverse(this_01);
  OpenMD::operator*(m,v);
  Vector3<double>::Vector3(this_00,v_00);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3acb96);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3acba3);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3acbb0);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3acbbd);
  SquareMatrix<double,_6>::~SquareMatrix((SquareMatrix<double,_6> *)0x3acbca);
  return in_RDI;
}

Assistant:

Vector3d HydroProp::getCenterOfDiffusion(RealType temperature) {
    // First get the Diffusion tensor at the origin of the coordinate system:

    Vector3d origin(0.0);
    Mat6x6d Do = getDiffusionTensorAtPos(origin, temperature);

    Mat3x3d Dotr;
    Mat3x3d Dorr;

    Do.getSubMatrix(3, 0, Dotr);
    Do.getSubMatrix(3, 3, Dorr);

    Mat3x3d tmp;
    Vector3d tmpVec;

    // Find center of diffusion
    tmp(0, 0) = Dorr(1, 1) + Dorr(2, 2);
    tmp(0, 1) = -Dorr(0, 1);
    tmp(0, 2) = -Dorr(0, 2);
    tmp(1, 0) = -Dorr(0, 1);
    tmp(1, 1) = Dorr(0, 0) + Dorr(2, 2);
    tmp(1, 2) = -Dorr(1, 2);
    tmp(2, 0) = -Dorr(0, 2);
    tmp(2, 1) = -Dorr(1, 2);
    tmp(2, 2) = Dorr(1, 1) + Dorr(0, 0);

    // Vector3d tmpVec;
    tmpVec[0] = Dotr(1, 2) - Dotr(2, 1);
    tmpVec[1] = Dotr(2, 0) - Dotr(0, 2);
    tmpVec[2] = Dotr(0, 1) - Dotr(1, 0);

    // center of difussion
    Vector3d cod = tmp.inverse() * tmpVec;
    return cod;
  }